

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

void __thiscall ncnn::ParamDict::~ParamDict(ParamDict *this)

{
  ParamDict *in_RDI;
  
  ~ParamDict(in_RDI);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

ParamDict::~ParamDict()
{
    delete d;
}